

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvec.cpp
# Opt level: O1

uint32_t window1(void *blob,int len,int start,int count)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  uint32_t t;
  
  t = 0;
  if (0 < count) {
    uVar2 = 0;
    do {
      uVar3 = start % (len * 8) + uVar2;
      if ((*(byte *)((long)blob + ((long)(ulong)(uVar3 >> 3) % (long)len & 0xffffffffU)) >>
           (uVar3 & 7) & 1) == 0) {
        if (uVar2 < 0x20) {
          pbVar1 = (byte *)((long)&t + (ulong)(uVar2 >> 3));
          *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)uVar2 & 7));
        }
      }
      else if (uVar2 < 0x20) {
        pbVar1 = (byte *)((long)&t + (ulong)(uVar2 >> 3));
        *pbVar1 = *pbVar1 | (byte)(1 << ((byte)uVar2 & 7));
      }
      uVar2 = uVar2 + 1;
    } while (count != uVar2);
  }
  return t;
}

Assistant:

uint32_t window1 ( void * blob, int len, int start, int count )
{
  int nbits = len*8;
  start %= nbits;

  uint32_t t = 0;

  for(int i = 0; i < count; i++)
  {
    setbit(&t,sizeof(t),i, getbit_wrap(blob,len,start+i));
  }

  return t;
}